

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer_impl.cpp
# Opt level: O2

tuple<bool,_float>
intersect_triangle(vector<float,_std::allocator<float>_> *origin,Vector3f *ray,Vector3f *e1,
                  Vector3f *e2,Vector3f *v0)

{
  undefined1 uVar1;
  CommaInitializer<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this;
  Vector3f x;
  PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *local_c0 [3];
  MatrixXf A;
  HouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> local_90;
  PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> local_4c [12];
  HouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *local_40;
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  *local_38;
  
  local_90.m_qr.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data.
  _0_4_ = 3;
  local_c0[0] = (PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)CONCAT44(local_c0[0]._4_4_,3);
  Eigen::Matrix<float,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<float,_1,_1,0,_1,_1> *)&A,(int *)&local_90,(int *)local_c0);
  Eigen::CommaInitializer<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
  CommaInitializer<Eigen::Matrix<float,3,1,0,3,1>>
            ((CommaInitializer<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_90,
             (Matrix<float,__1,__1,_0,__1,__1> *)&A,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)e2);
  this = Eigen::CommaInitializer<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator_
                   ((CommaInitializer<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_90,
                    (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)v0);
  local_c0[0] = (PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)e1;
  Eigen::CommaInitializer<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)this,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)local_c0);
  Eigen::HouseholderQR<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
  HouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>
            ((HouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_90,
             (EigenBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&A);
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::_init1<float_const*>
            (local_4c,*(Scalar **)
                       (ray->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array);
  local_c0[0] = local_4c;
  local_40 = &local_90;
  local_38 = (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)local_c0;
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  _set_noalias<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&x,
             (DenseBase<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
              *)&local_40);
  Eigen::HouseholderQR<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR(&local_90);
  if (((0.0 <= x.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [0]) &&
      (0.0 <= x.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [1])) &&
     (x.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] +
      x.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] <= 1.0
     )) {
    uVar1 = 1;
    if (0.0 < x.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [2]) goto LAB_0012af88;
  }
  uVar1 = 0;
  x.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
LAB_0012af88:
  *(float *)&(origin->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start =
       x.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  *(undefined1 *)
   ((long)&(origin->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start + 4) = uVar1;
  free(A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return (tuple<bool,_float>)(_Tuple_impl<0UL,_bool,_float>)origin;
}

Assistant:

std::tuple<bool, float> intersect_triangle(
		std::vector<float> const& origin,
		Eigen::Vector3f const& ray,
		Eigen::Vector3f const& e1,
		Eigen::Vector3f const& e2,
		Eigen::Vector3f const& v0) {
	using namespace Eigen;
	auto A = MatrixXf(3, 3);
	A << e1, e2, -ray;
	auto x = static_cast<Vector3f>(A.householderQr().solve(Vector3f(origin.data())-v0));
	if(0 <= x[0] && 0 <= x[1] && x[0]+x[1] <= 1.0 && 0 < x[2]) {
		return std::make_tuple(true, x[2]);
	}
	return std::make_tuple(false, 0.0);
}